

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cGLSLnoperspectiveTests.cpp
# Opt level: O0

void gl3cts::compile_shader(Context *context,GLuint shader_id,GLchar *shader_code)

{
  code *pcVar1;
  undefined4 uVar2;
  Functions *__s;
  GLuint GVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  reference pvVar8;
  TestContext *this;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  TestError *this_00;
  allocator<char> local_221;
  string local_220;
  LogKernelSource local_200;
  reference local_1e0;
  MessageBuilder local_1d8;
  undefined1 local_48 [8];
  vector<char,_std::allocator<char>_> message;
  GLint length;
  GLint status;
  Functions *gl;
  GLchar *shader_code_local;
  Context *pCStack_10;
  GLuint shader_id_local;
  Context *context_local;
  long lVar7;
  
  gl = (Functions *)shader_code;
  shader_code_local._4_4_ = shader_id;
  pCStack_10 = context;
  pRVar6 = deqp::Context::getRenderContext(context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
  (**(code **)(lVar7 + 0x12b8))(shader_code_local._4_4_,1,&gl,0);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"ShaderSource",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                  ,0x34);
  (**(code **)(lVar7 + 0x248))(shader_code_local._4_4_);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"CompileShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                  ,0x38);
  (**(code **)(lVar7 + 0xa70))
            (shader_code_local._4_4_,0x8b81,
             &message.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"GetShaderiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                  ,0x3c);
  if (message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ != 1) {
    message.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 0;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_48);
    (**(code **)(lVar7 + 0xa70))
              (shader_code_local._4_4_,0x8b84,
               &message.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"GetShaderiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x46);
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)local_48,
               (long)(int)message.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_);
    GVar3 = shader_code_local._4_4_;
    uVar2 = message.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
    pcVar1 = *(code **)(lVar7 + 0xa58);
    pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_48,0);
    (*pcVar1)(GVar3,uVar2,0,pvVar8);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"GetShaderInfoLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
                    ,0x4d);
    this = deqp::Context::getTestContext(pCStack_10);
    pTVar9 = tcu::TestContext::getLog(this);
    tcu::TestLog::operator<<(&local_1d8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<
                        (&local_1d8,(char (*) [27])"Failed to compile shader:\n");
    local_1e0 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_48,0);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_1e0);
    pTVar9 = tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    __s = gl;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,(char *)__s,&local_221);
    tcu::LogKernelSource::LogKernelSource(&local_200,&local_220);
    tcu::TestLog::operator<<(pTVar9,&local_200);
    tcu::LogKernelSource::~LogKernelSource(&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
    tcu::MessageBuilder::~MessageBuilder(&local_1d8);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Failed to compile shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGLSLnoperspectiveTests.cpp"
               ,0x54);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void compile_shader(deqp::Context& context, glw::GLuint shader_id, const glw::GLchar* shader_code)
{
	/* GL entry points */
	const glw::Functions& gl = context.getRenderContext().getFunctions();

	/* Compilation status */
	glw::GLint status = GL_FALSE;

	/* Set source code */
	gl.shaderSource(shader_id, 1 /* count */, &shader_code, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ShaderSource");

	/* Compile */
	gl.compileShader(shader_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "CompileShader");

	/* Get compilation status */
	gl.getShaderiv(shader_id, GL_COMPILE_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

	/* Log compilation error */
	if (GL_TRUE != status)
	{
		glw::GLint				 length = 0;
		std::vector<glw::GLchar> message;

		/* Error log length */
		gl.getShaderiv(shader_id, GL_INFO_LOG_LENGTH, &length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

		/* Prepare storage */
		message.resize(length);

		/* Get error log */
		gl.getShaderInfoLog(shader_id, length, 0, &message[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderInfoLog");

		/* Log */
		context.getTestContext().getLog() << tcu::TestLog::Message << "Failed to compile shader:\n"
										  << &message[0] << tcu::TestLog::EndMessage
										  << tcu::TestLog::KernelSource(shader_code);

		TCU_FAIL("Failed to compile shader");
	}
}